

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_examples.cpp
# Opt level: O2

void leftRotateBMP(TRIPLERGB **mrx,BITMAPFILEHEADER bmFile,BITMAPINFOHEADER bmInfo,char *filename,
                  int rotate)

{
  undefined1 auVar1 [16];
  BITMAPINFOHEADER bmInfo_00;
  uchar uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  TRIPLERGB **matrix;
  ulong uVar6;
  TRIPLERGB *pTVar7;
  uint uVar8;
  uint uVar9;
  int j;
  ulong uVar10;
  TRIPLERGB *pTVar11;
  ulong uVar12;
  ulong uVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string command;
  
  uVar3 = bmInfo.biWidth;
  uVar4 = bmInfo.biHeight;
  if (rotate % 0xb4 != 0) {
    bmInfo.biHeight = bmInfo.biWidth;
    bmInfo.biWidth = uVar4;
  }
  uVar12 = 0;
  uVar6 = (long)(int)bmInfo.biHeight * 8;
  if ((int)bmInfo.biHeight < 0) {
    uVar6 = 0xffffffffffffffff;
  }
  uVar5 = (ulong)bmInfo.biHeight;
  if ((int)bmInfo.biHeight < 1) {
    uVar5 = uVar12;
  }
  matrix = (TRIPLERGB **)operator_new__(uVar6);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(int)bmInfo.biWidth;
  uVar6 = SUB168(auVar1 * ZEXT816(3),0);
  if (SUB168(auVar1 * ZEXT816(3),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  uVar13 = (ulong)bmInfo.biWidth;
  if ((int)bmInfo.biWidth < 1) {
    uVar13 = uVar12;
  }
  do {
    if (uVar12 == uVar5) {
      bmInfo_00.biWidth = bmInfo.biWidth;
      bmInfo_00.biSize = bmInfo.biSize;
      bmInfo_00.biPlanes = bmInfo.biPlanes;
      bmInfo_00.biBitCount = bmInfo.biBitCount;
      bmInfo_00.biHeight = bmInfo.biHeight;
      bmInfo_00.biCompression = bmInfo.biCompression;
      bmInfo_00.biSizeImage = bmInfo.biSizeImage;
      bmInfo_00.biXPelsPerMeter = bmInfo.biXPelsPerMeter;
      bmInfo_00.biYPelsPerMeter = bmInfo.biYPelsPerMeter;
      bmInfo_00.biClrUsed = bmInfo.biClrUsed;
      bmInfo_00.biClrImportant = bmInfo.biClrImportant;
      saveBMPFile(bmFile,bmInfo_00,matrix,filename);
      std::__cxx11::string::string((string *)&command,"display ",(allocator *)&local_70);
      std::operator+(&local_70,&command,filename);
      system(local_70._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&command);
      return;
    }
    pTVar7 = (TRIPLERGB *)operator_new__(uVar6);
    matrix[uVar12] = pTVar7;
    uVar10 = 0;
    uVar8 = uVar4;
    uVar9 = uVar3;
    while( true ) {
      uVar9 = uVar9 - 1;
      uVar8 = uVar8 - 1;
      if (uVar13 == uVar10) break;
      if (rotate == 0x10e) {
        pTVar11 = mrx[(int)uVar8] + uVar12;
LAB_0010c1c0:
        pTVar7->red = pTVar11->red;
        uVar2 = pTVar11->green;
        pTVar7->blue = pTVar11->blue;
        pTVar7->green = uVar2;
      }
      else {
        if (rotate == 0xb4) {
          pTVar11 = mrx[(int)(uVar4 + ~(uint)uVar12)] + (int)uVar9;
          goto LAB_0010c1c0;
        }
        if (rotate == 0x5a) {
          pTVar11 = mrx[uVar10] + (int)(~(uint)uVar12 + uVar3);
          goto LAB_0010c1c0;
        }
      }
      uVar10 = uVar10 + 1;
      pTVar7 = pTVar7 + 1;
    }
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

void leftRotateBMP(TRIPLERGB **mrx, BITMAPFILEHEADER bmFile, BITMAPINFOHEADER bmInfo,
                   const char *filename, int rotate) {
    int height = bmInfo.biHeight;
    int width = bmInfo.biWidth;
    int newHeight = ((rotate % 180) != 0) ? bmInfo.biHeight = width : height;
    int newWidth = ((rotate % 180) != 0) ? bmInfo.biWidth = height : width;

    TRIPLERGB **newMrx = new TRIPLERGB *[newHeight];

    for (int i = 0; i < newHeight; i++) {
        newMrx[i] = new TRIPLERGB[newWidth];
        for (int j = 0; j < newWidth; j++) {
            switch (rotate) {
                case 90:
                    newMrx[i][j] = mrx[j][width - i - 1];
                    break;
                case 180:
                    newMrx[i][j] = mrx[height - i - 1][width - j - 1];
                    break;
                case 270:
                    newMrx[i][j] = mrx[height - j - 1][i];
                    break;
                default:
                    break;
            }
        }
    }
    saveBMPFile(bmFile, bmInfo, newMrx, filename);
    std::string command = "display ";
    system((command + filename).c_str());
}